

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicValue::Pipeline::Pipeline(Pipeline *this,Pipeline *other)

{
  Disposer *pDVar1;
  Type local_c;
  
  local_c = other->type;
  this->type = local_c;
  if (local_c != UNKNOWN) {
    if (local_c == CAPABILITY) {
      pDVar1 = (other->field_1).structValue.typeless.hook.disposer;
      (this->field_1).structValue.schema.super_Schema.raw =
           (other->field_1).structValue.schema.super_Schema.raw;
      (this->field_1).structValue.typeless.hook.disposer = pDVar1;
      (other->field_1).structValue.typeless.hook.disposer = (Disposer *)0x0;
      (this->field_1).structValue.typeless.hook.ptr = (other->field_1).structValue.typeless.hook.ptr
      ;
    }
    else {
      if (local_c == STRUCT) {
        DynamicStruct::Pipeline::Pipeline
                  (&(this->field_1).structValue,&(other->field_1).structValue);
        return;
      }
      if (kj::_::Debug::minSeverity < 3) {
        kj::_::Debug::log<char_const(&)[26],unsigned_int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x68c,ERROR,"\"Unexpected pipeline type.\", (uint)type",
                   (char (*) [26])"Unexpected pipeline type.",&local_c);
      }
      this->type = UNKNOWN;
    }
  }
  return;
}

Assistant:

DynamicValue::Pipeline::Pipeline(Pipeline&& other) noexcept: type(other.type) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::ctor(structValue, kj::mv(other.structValue)); break;
    case CAPABILITY: kj::ctor(capabilityValue, kj::mv(other.capabilityValue)); break;
    default:
      KJ_LOG(ERROR, "Unexpected pipeline type.", (uint)type);
      type = UNKNOWN;
      break;
  }
}